

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_array_equal_u16string_literal(void)

{
  size_type sVar1;
  basic_variable<std::allocator<char>_> *pbVar2;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  basic_variable<std::allocator<char>_> *local_518;
  basic_variable<std::allocator<char>_> *local_500;
  basic_variable<std::allocator<char>_> *local_4e8;
  basic_variable<std::allocator<char>_> *local_4d0;
  undefined1 local_4a1;
  basic_variable<std::allocator<char>_> *local_4a0;
  basic_variable<std::allocator<char>_> local_498;
  basic_variable<std::allocator<char>_> local_468;
  basic_variable<std::allocator<char>_> local_438;
  undefined1 local_408 [69];
  undefined1 local_3c3 [2];
  undefined1 local_3c1;
  basic_variable<std::allocator<char>_> *local_3c0;
  basic_variable<std::allocator<char>_> local_3b8;
  basic_variable<std::allocator<char>_> local_388;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_328 [69];
  undefined1 local_2e3 [2];
  undefined1 local_2e1;
  basic_variable<std::allocator<char>_> *local_2e0;
  basic_variable<std::allocator<char>_> local_2d8;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  undefined1 local_248 [69];
  undefined1 local_203 [2];
  undefined1 local_201;
  basic_variable<std::allocator<char>_> *local_200;
  basic_variable<std::allocator<char>_> local_1f8;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_168 [77];
  undefined1 local_11b [2];
  undefined1 local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_db [2];
  undefined1 local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9b [2];
  undefined1 local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [21];
  undefined1 local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_a[0] = trial::dynamic::operator==(&local_48,(char16_t (*) [1])0x247fba);
  local_49 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == u\"\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd4b,"void equality_suite::compare_array_equal_u16string_literal()",local_a,&local_49
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_5e[0] = trial::dynamic::operator!=(&local_98,(char16_t (*) [1])0x247fba);
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != u\"\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd4c,"void equality_suite::compare_array_equal_u16string_literal()",local_5e,
             &local_99);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_9b[0] = trial::dynamic::operator==(&local_d8,(char16_t (*) [8])L"charlie");
  local_d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == u\"charlie\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd4d,"void equality_suite::compare_array_equal_u16string_literal()",local_9b,
             &local_d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_db[0] = trial::dynamic::operator!=(&local_118,(char16_t (*) [8])L"charlie");
  local_119 = 1;
  sVar1 = 0xd4e;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != u\"charlie\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd4e,"void equality_suite::compare_array_equal_u16string_literal()",local_db,
             &local_119);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  local_200 = &local_1f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_200,1);
  local_200 = &local_1c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_200,2);
  local_200 = &local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_200,3);
  local_168._0_8_ = &local_1f8;
  local_168._8_8_ = 3;
  init._M_len = sVar1;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10),
             (basic_array<std::allocator<char>_> *)local_168._0_8_,init);
  local_11b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10),
                            (char16_t (*) [1])0x247fba);
  local_201 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == u\"\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd50,"void equality_suite::compare_array_equal_u16string_literal()",local_11b,
             &local_201);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10));
  pbVar2 = &local_1f8;
  local_4d0 = (basic_variable<std::allocator<char>_> *)local_168;
  do {
    local_4d0 = local_4d0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_4d0);
  } while (local_4d0 != pbVar2);
  local_2e0 = &local_2d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2e0,1);
  local_2e0 = &local_2a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2e0,2);
  local_2e0 = &local_278;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2e0,3);
  local_248._0_8_ = &local_2d8;
  local_248._8_8_ = 3;
  init_00._M_len = (size_type)pbVar2;
  init_00._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_248 + 0x10),
             (basic_array<std::allocator<char>_> *)local_248._0_8_,init_00);
  local_203[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_248 + 0x10),
                            (char16_t (*) [1])0x247fba);
  local_2e1 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != u\"\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd51,"void equality_suite::compare_array_equal_u16string_literal()",local_203,
             &local_2e1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_248 + 0x10));
  pbVar2 = &local_2d8;
  local_4e8 = (basic_variable<std::allocator<char>_> *)local_248;
  do {
    local_4e8 = local_4e8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_4e8);
  } while (local_4e8 != pbVar2);
  local_3c0 = &local_3b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3c0,1);
  local_3c0 = &local_388;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3c0,2);
  local_3c0 = &local_358;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3c0,3);
  local_328._0_8_ = &local_3b8;
  local_328._8_8_ = 3;
  init_01._M_len = (size_type)pbVar2;
  init_01._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_328 + 0x10),
             (basic_array<std::allocator<char>_> *)local_328._0_8_,init_01);
  local_2e3[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_328 + 0x10),
                            (char16_t (*) [8])L"charlie");
  local_3c1 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == u\"charlie\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd52,"void equality_suite::compare_array_equal_u16string_literal()",local_2e3,
             &local_3c1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_328 + 0x10));
  pbVar2 = &local_3b8;
  local_500 = (basic_variable<std::allocator<char>_> *)local_328;
  do {
    local_500 = local_500 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_500);
  } while (local_500 != pbVar2);
  local_4a0 = &local_498;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4a0,1);
  local_4a0 = &local_468;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4a0,2);
  local_4a0 = &local_438;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4a0,3);
  local_408._0_8_ = &local_498;
  local_408._8_8_ = 3;
  init_02._M_len = (size_type)pbVar2;
  init_02._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_408 + 0x10),
             (basic_array<std::allocator<char>_> *)local_408._0_8_,init_02);
  local_3c3[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_408 + 0x10),
                            (char16_t (*) [8])L"charlie");
  local_4a1 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != u\"charlie\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd53,"void equality_suite::compare_array_equal_u16string_literal()",local_3c3,
             &local_4a1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_408 + 0x10));
  local_518 = (basic_variable<std::allocator<char>_> *)local_408;
  do {
    local_518 = local_518 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_518);
  } while (local_518 != &local_498);
  return;
}

Assistant:

void compare_array_equal_u16string_literal()
{
    TRIAL_PROTOCOL_TEST_EQUAL(array::make() == u"", false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make() != u"", true);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make() == u"charlie", false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make() != u"charlie", true);

    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == u"", false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != u"", true);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == u"charlie", false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != u"charlie", true);
}